

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O2

void nn_sipc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_queue_item *self_00;
  int *self_01;
  nn_usock *self_02;
  int iVar1;
  uint64_t size;
  void *buf;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 uVar5;
  size_t opt_sz;
  int opt;
  
  uVar4 = (ulong)(uint)src;
  opt_sz = 4;
  switch(*(undefined4 *)&self[1].fn) {
  case 1:
    if (src == -2) {
      if (type == -2) {
        nn_streamhdr_start((nn_streamhdr *)&self[1].state,(nn_usock *)self[1].shutdown_fn,
                           (nn_pipebase *)(self + 6));
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected action";
      uVar4 = 0xfffffffffffffffe;
      uVar5 = 0xea;
    }
    else {
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected source";
      uVar5 = 0xee;
    }
    break;
  case 2:
    if (src == 2) {
      if (type == 2) {
LAB_00120824:
        *(undefined4 *)&self[1].fn = 6;
        nn_fsm_raise(self,(nn_fsm_event *)(self + 0xb),1);
        return;
      }
      if (type == 1) {
        nn_streamhdr_stop((nn_streamhdr *)&self[1].state);
        *(undefined4 *)&self[1].fn = 3;
        return;
      }
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected action";
      uVar4 = 2;
      uVar5 = 0x10a;
    }
    else {
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected source";
      uVar5 = 0x10e;
    }
    break;
  case 3:
    if (src == 2) {
      if (type == 3) {
        iVar1 = nn_pipebase_start((nn_pipebase *)(self + 6));
        if (-1 < iVar1) {
          *(undefined4 *)&self[8].ctx = 1;
          nn_usock_recv((nn_usock *)self[1].shutdown_fn,(void *)((long)&self[8].ctx + 4),9,
                        (int *)0x0);
          *(undefined4 *)&self[9].stopped.srcptr = 1;
          *(undefined4 *)&self[1].fn = 4;
          return;
        }
        goto LAB_00120824;
      }
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected action";
      uVar4 = 2;
      uVar5 = 0x12f;
    }
    else {
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected source";
      uVar5 = 0x133;
    }
    break;
  case 4:
    if (src == 1) {
      switch(type) {
      case 3:
        if (*(int *)&self[9].stopped.srcptr == 2) {
          *(undefined4 *)&self[9].stopped.srcptr = 1;
          self_00 = &self[9].stopped.item;
          nn_msg_term((nn_msg *)self_00);
          nn_msg_init((nn_msg *)self_00,0);
          nn_pipebase_sent((nn_pipebase *)(self + 6));
          return;
        }
        nn_backtrace_print();
        pcVar3 = "sipc->outstate == NN_SIPC_OUTSTATE_SENDING";
        uVar5 = 0x141;
        break;
      case 4:
        if (*(int *)&self[8].ctx == 2) {
          *(undefined4 *)&self[8].ctx = 3;
          nn_pipebase_received((nn_pipebase *)(self + 6));
          return;
        }
        if (*(int *)&self[8].ctx == 1) {
          if (*(char *)((long)&self[8].ctx + 4) == '\x01') {
            size = nn_getll((uint8_t *)((long)&self[8].ctx + 5));
            nn_pipebase_getopt((nn_pipebase *)(self + 6),0,0x10,&opt,&opt_sz);
            if ((uint)opt < size && -1 < opt) {
              *(undefined4 *)&self[1].fn = 6;
              nn_fsm_raise(self,(nn_fsm_event *)(self + 0xb),1);
              return;
            }
            self_01 = &self[8].stopped.src;
            nn_msg_term((nn_msg *)self_01);
            nn_msg_init((nn_msg *)self_01,size);
            if (size != 0) {
              *(undefined4 *)&self[8].ctx = 2;
              self_02 = (nn_usock *)self[1].shutdown_fn;
              buf = nn_chunkref_data((nn_chunkref *)&self[9].owner);
              nn_usock_recv(self_02,buf,size,(int *)0x0);
              return;
            }
            *(undefined4 *)&self[8].ctx = 3;
            nn_pipebase_received((nn_pipebase *)(self + 6));
            return;
          }
          nn_backtrace_print();
          pcVar3 = "sipc->inhdr [0] == NN_SIPC_MSG_NORMAL";
          uVar5 = 0x150;
        }
        else {
          nn_backtrace_print();
          pcVar3 = "0";
          uVar5 = 0x179;
        }
        break;
      case 5:
        nn_pipebase_stop((nn_pipebase *)(self + 6));
        goto LAB_00120824;
      default:
        nn_backtrace_print();
        uVar2 = (ulong)*(uint *)&self[1].fn;
        pcVar3 = "Unexpected action";
        uVar4 = 1;
        uVar5 = 0x189;
        goto LAB_00120c50;
      case 8:
        nn_pipebase_stop((nn_pipebase *)(self + 6));
        *(undefined4 *)&self[1].fn = 5;
        return;
      }
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar3,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/sipc.c"
              ,uVar5);
      goto LAB_001209da;
    }
    nn_backtrace_print();
    uVar2 = (ulong)*(uint *)&self[1].fn;
    pcVar3 = "Unexpected source";
    uVar5 = 0x18d;
    break;
  case 5:
    if (src == 1) {
      if (type == 5) goto LAB_00120824;
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected action";
      uVar4 = 1;
      uVar5 = 0x19f;
    }
    else {
      nn_backtrace_print();
      uVar2 = (ulong)*(uint *)&self[1].fn;
      pcVar3 = "Unexpected source";
      uVar5 = 0x1a3;
    }
    break;
  case 6:
    nn_backtrace_print();
    uVar2 = (ulong)*(uint *)&self[1].fn;
    pcVar3 = "Unexpected source";
    uVar5 = 0x1ac;
    break;
  default:
    nn_backtrace_print();
    uVar2 = (ulong)*(uint *)&self[1].fn;
    pcVar3 = "Unexpected state";
    uVar5 = 0x1b3;
  }
LAB_00120c50:
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar3,uVar2,uVar4,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ipc/sipc.c"
          ,uVar5);
LAB_001209da:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_sipc_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    int rc;
    struct nn_sipc *sipc;
    uint64_t size;
    int opt;
    size_t opt_sz = sizeof (opt);

    sipc = nn_cont (self, struct nn_sipc, fsm);


    switch (sipc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_SIPC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                nn_streamhdr_start (&sipc->streamhdr, sipc->usock,
                    &sipc->pipebase);
                sipc->state = NN_SIPC_STATE_PROTOHDR;
                return;
            default:
                nn_fsm_bad_action (sipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sipc->state, src, type);
        }

/******************************************************************************/
/*  PROTOHDR state.                                                           */
/******************************************************************************/
    case NN_SIPC_STATE_PROTOHDR:
        switch (src) {

        case NN_SIPC_SRC_STREAMHDR:
            switch (type) {
            case NN_STREAMHDR_OK:

                /*  Before moving to the active state stop the streamhdr
                    state machine. */
                nn_streamhdr_stop (&sipc->streamhdr);
                sipc->state = NN_SIPC_STATE_STOPPING_STREAMHDR;
                return;

            case NN_STREAMHDR_ERROR:

                /* Raise the error and move directly to the DONE state.
                   streamhdr object will be stopped later on. */
                sipc->state = NN_SIPC_STATE_DONE;
                nn_fsm_raise (&sipc->fsm, &sipc->done, NN_SIPC_ERROR);
                return;

            default:
                nn_fsm_bad_action (sipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sipc->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_STREAMHDR state.                                                 */
/******************************************************************************/
    case NN_SIPC_STATE_STOPPING_STREAMHDR:
        switch (src) {

        case NN_SIPC_SRC_STREAMHDR:
            switch (type) {
            case NN_STREAMHDR_STOPPED:

                 /*  Start the pipe. */
                 rc = nn_pipebase_start (&sipc->pipebase);
                 if (nn_slow (rc < 0)) {
                    sipc->state = NN_SIPC_STATE_DONE;
                    nn_fsm_raise (&sipc->fsm, &sipc->done, NN_SIPC_ERROR);
                    return;
                 }

                 /*  Start receiving a message in asynchronous manner. */
                 sipc->instate = NN_SIPC_INSTATE_HDR;
                 nn_usock_recv (sipc->usock, &sipc->inhdr,
                     sizeof (sipc->inhdr), NULL);

                 /*  Mark the pipe as available for sending. */
                 sipc->outstate = NN_SIPC_OUTSTATE_IDLE;

                 sipc->state = NN_SIPC_STATE_ACTIVE;
                 return;

            default:
                nn_fsm_bad_action (sipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sipc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_SIPC_STATE_ACTIVE:
        switch (src) {

        case NN_SIPC_SRC_USOCK:
            switch (type) {
            case NN_USOCK_SENT:

                /*  The message is now fully sent. */
                nn_assert (sipc->outstate == NN_SIPC_OUTSTATE_SENDING);
                sipc->outstate = NN_SIPC_OUTSTATE_IDLE;
                nn_msg_term (&sipc->outmsg);
                nn_msg_init (&sipc->outmsg, 0);
                nn_pipebase_sent (&sipc->pipebase);
                return;

            case NN_USOCK_RECEIVED:

                switch (sipc->instate) {
                case NN_SIPC_INSTATE_HDR:

                    /*  Message header was received. Check that message size
                        is acceptable by comparing with NN_RCVMAXSIZE;
                        if it's too large, drop the connection. */
                    nn_assert (sipc->inhdr [0] == NN_SIPC_MSG_NORMAL);
                    size = nn_getll (sipc->inhdr + 1);

                    nn_pipebase_getopt (&sipc->pipebase, NN_SOL_SOCKET,
                        NN_RCVMAXSIZE, &opt, &opt_sz);

                    if (opt >= 0 && size > (unsigned)opt) {
                        sipc->state = NN_SIPC_STATE_DONE;
                        nn_fsm_raise (&sipc->fsm, &sipc->done, NN_SIPC_ERROR);
                        return;
                    }

                    /*  Allocate memory for the message. */
                    nn_msg_term (&sipc->inmsg);
                    nn_msg_init (&sipc->inmsg, (size_t) size);

                    /*  Special case when size of the message body is 0. */
                    if (!size) {
                        sipc->instate = NN_SIPC_INSTATE_HASMSG;
                        nn_pipebase_received (&sipc->pipebase);
                        return;
                    }

                    /*  Start receiving the message body. */
                    sipc->instate = NN_SIPC_INSTATE_BODY;
                    nn_usock_recv (sipc->usock,
                        nn_chunkref_data (&sipc->inmsg.body),
                        (size_t) size, NULL);

                    return;

                case NN_SIPC_INSTATE_BODY:

                    /*  Message body was received. Notify the owner that it
                        can receive it. */
                    sipc->instate = NN_SIPC_INSTATE_HASMSG;
                    nn_pipebase_received (&sipc->pipebase);

                    return;

                default:
                    nn_assert (0);
                }

            case NN_USOCK_SHUTDOWN:
                nn_pipebase_stop (&sipc->pipebase);
                sipc->state = NN_SIPC_STATE_SHUTTING_DOWN;
                return;

            case NN_USOCK_ERROR:
                nn_pipebase_stop (&sipc->pipebase);
                sipc->state = NN_SIPC_STATE_DONE;
                nn_fsm_raise (&sipc->fsm, &sipc->done, NN_SIPC_ERROR);
                return;


            default:
                nn_fsm_bad_action (sipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sipc->state, src, type);
        }

/******************************************************************************/
/*  SHUTTING_DOWN state.                                                      */
/*  The underlying connection is closed. We are just waiting that underlying  */
/*  usock being closed                                                        */
/******************************************************************************/
    case NN_SIPC_STATE_SHUTTING_DOWN:
        switch (src) {

        case NN_SIPC_SRC_USOCK:
            switch (type) {
            case NN_USOCK_ERROR:
                sipc->state = NN_SIPC_STATE_DONE;
                nn_fsm_raise (&sipc->fsm, &sipc->done, NN_SIPC_ERROR);
                return;
            default:
                nn_fsm_bad_action (sipc->state, src, type);
            }

        default:
            nn_fsm_bad_source (sipc->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  The underlying connection is closed. There's nothing that can be done in  */
/*  this state except stopping the object.                                    */
/******************************************************************************/
    case NN_SIPC_STATE_DONE:
        nn_fsm_bad_source (sipc->state, src, type);


/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (sipc->state, src, type);
    }
}